

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O2

size_t __thiscall std::hash<wasm::Literal>::operator()(hash<wasm::Literal> *this,Literal *a)

{
  Type *value;
  char cVar1;
  bool bVar2;
  BasicType BVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  long *plVar7;
  long lVar8;
  undefined8 uVar9;
  ulong uVar10;
  Literal *pLVar11;
  uintptr_t uVar12;
  Name NVar13;
  Iterator IVar14;
  undefined1 local_68 [8];
  value_type c;
  
  value = &a->type;
  sVar5 = wasm::hash<wasm::Type>(value);
  if (6 < (a->type).id) {
    cVar1 = wasm::Type::isRef();
    if (cVar1 == '\0') goto switchD_0014552c_default;
    bVar2 = wasm::Type::isNull(value);
    if (bVar2) {
      return sVar5;
    }
    cVar1 = wasm::Type::isFunction();
    if (cVar1 != '\0') {
      NVar13 = wasm::Literal::getFunc(a);
      return sVar5 ^ (ulong)(NVar13.super_IString.str._M_str +
                            (sVar5 >> 4) + sVar5 * 0x1000 + -0x61c8864680b583eb);
    }
    lVar6 = wasm::Type::getHeapType();
    if (lVar6 != 4) {
      cVar1 = wasm::Type::isString();
      if (cVar1 != '\0') {
        wasm::Literal::getGCData();
        __shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&c);
        uVar10 = sVar5 ^ (sVar5 >> 4) + sVar5 * 0x1000 + *(long *)((long)local_68 + 8) +
                         -0x61c8864680b583eb +
                         (*(long *)((long)local_68 + 0x30) - *(long *)((long)local_68 + 0x28)) /
                         0x18;
        IVar14 = wasm::SmallVector<wasm::Literal,_1UL>::end
                           ((SmallVector<wasm::Literal,_1UL> *)((long)local_68 + 8));
        c.type.id = IVar14.
                    super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                    .index;
        lVar6 = -0x18;
        for (uVar12 = 0;
            c.type.id != uVar12 ||
            IVar14.
            super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
            .parent != (SmallVector<wasm::Literal,_1UL> *)((long)local_68 + 8); uVar12 = uVar12 + 1)
        {
          pLVar11 = (Literal *)(*(long *)((long)local_68 + 0x28) + lVar6);
          if (uVar12 == 0) {
            pLVar11 = (Literal *)((long)local_68 + 0x10);
          }
          wasm::Literal::Literal((Literal *)local_68,pLVar11);
          lVar8 = wasm::Literal::getInteger();
          uVar10 = uVar10 ^ uVar10 * 0x1000 + -0x61c8864680b583eb + (uVar10 >> 4) + lVar8;
          wasm::Literal::~Literal((Literal *)local_68);
          lVar6 = lVar6 + 0x18;
        }
        return uVar10;
      }
      goto LAB_0014576f;
    }
    iVar4 = wasm::Literal::geti31(a,true);
    goto LAB_00145608;
  }
  BVar3 = wasm::Type::getBasic(value);
  switch(BVar3) {
  case i32:
    iVar4 = wasm::Literal::geti32(a);
    break;
  case i64:
    lVar6 = wasm::Literal::geti64(a);
    goto LAB_0014561e;
  case f32:
    iVar4 = wasm::Literal::reinterpreti32(a);
    break;
  case f64:
    lVar6 = wasm::Literal::reinterpreti64(a);
    goto LAB_0014561e;
  case v128:
    plVar7 = (long *)wasm::Literal::getv128Ptr(a);
    uVar10 = (sVar5 >> 4) + sVar5 * 0x1000 + *plVar7 + 0x9e3779b97f4a7c15 ^ sVar5;
    return (uVar10 >> 4) + 0x9e3779b97f4a7c15 + uVar10 * 0x1000 + plVar7[1] ^ uVar10;
  default:
switchD_0014552c_default:
    wasm::handle_unreachable
              ("unexpected type",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
               ,0x313);
LAB_0014576f:
    uVar9 = wasm::handle_unreachable
                      ("unexpected type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                       ,0x311);
    wasm::Literal::~Literal((Literal *)local_68);
    _Unwind_Resume(uVar9);
  }
LAB_00145608:
  lVar6 = (long)iVar4;
LAB_0014561e:
  return sVar5 ^ lVar6 + -0x61c8864680b583eb + (sVar5 >> 4) + sVar5 * 0x1000;
}

Assistant:

size_t operator()(const wasm::Literal& a) const {
    auto digest = wasm::hash(a.type);
    if (a.type.isBasic()) {
      switch (a.type.getBasic()) {
        case wasm::Type::i32:
          wasm::rehash(digest, a.geti32());
          return digest;
        case wasm::Type::f32:
          wasm::rehash(digest, a.reinterpreti32());
          return digest;
        case wasm::Type::i64:
          wasm::rehash(digest, a.geti64());
          return digest;
        case wasm::Type::f64:
          wasm::rehash(digest, a.reinterpreti64());
          return digest;
        case wasm::Type::v128:
          uint64_t chunks[2];
          memcpy(&chunks, a.getv128Ptr(), 16);
          wasm::rehash(digest, chunks[0]);
          wasm::rehash(digest, chunks[1]);
          return digest;
        case wasm::Type::none:
        case wasm::Type::unreachable:
          break;
      }
    } else if (a.type.isRef()) {
      if (a.isNull()) {
        return digest;
      }
      if (a.type.isFunction()) {
        wasm::rehash(digest, a.getFunc());
        return digest;
      }
      if (a.type.getHeapType() == wasm::HeapType::i31) {
        wasm::rehash(digest, a.geti31(true));
        return digest;
      }
      if (a.type.isString()) {
        auto& values = a.getGCData()->values;
        wasm::rehash(digest, values.size());
        for (auto c : values) {
          wasm::rehash(digest, c.getInteger());
        }
        return digest;
      }
      // other non-null reference type literals cannot represent concrete
      // values, i.e. there is no concrete anyref or eqref other than null.
      WASM_UNREACHABLE("unexpected type");
    }
    WASM_UNREACHABLE("unexpected type");
  }